

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O3

IterateResult __thiscall
glcts::TessellationShaderTCTEgl_TessLevel::iterate(TessellationShaderTCTEgl_TessLevel *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 dVar2;
  uint uVar3;
  undefined4 extraout_var;
  long lVar5;
  ulong uVar6;
  MessageBuilder *this_01;
  TestError *pTVar7;
  _tessellation_shader_vertex_spacing vertex_spacing;
  long lVar8;
  pointer p_Var9;
  char *msg;
  float *pfVar10;
  float fVar11;
  float fVar12;
  float outer_level1_clamped;
  float outer_level0_clamped;
  string vertex_spacing_mode_string;
  float local_200;
  float local_1fc;
  float local_1f8;
  float fStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined8 local_1e0;
  pointer local_1d8;
  string local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  initTest(this);
  (**(code **)(lVar4 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glPatchParameteriEXT() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xdd4);
  (**(code **)(lVar4 + 0x5e0))(0x8c89);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xdd8);
  p_Var9 = (this->m_tests).
           super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var9 != (this->m_tests).
                super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      lVar8 = 0;
      do {
        local_1e0 = (&DAT_01b60a80)[lVar8 * 3];
        lVar5 = lVar8 * 0x18;
        local_1f8 = *(float *)(&DAT_01b60a88 + lVar5);
        fStack_1f4 = *(float *)(&UNK_01b60a8c + lVar5);
        uStack_1f0 = *(undefined4 *)(&UNK_01b60a90 + lVar5);
        uStack_1ec = *(undefined4 *)(&UNK_01b60a94 + lVar5);
        (**(code **)(lVar4 + 0x1680))(p_Var9->po_id);
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"glUseProgram() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xdf3);
        if (p_Var9->type == TESSELLATION_TEST_TYPE_TES) {
          uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
          if ((uVar3 & 0x300) != 0) {
            (**(code **)(lVar4 + 0xfd0))(0x8e73,&local_1e0);
            dVar2 = (**(code **)(lVar4 + 0x800))();
            glu::checkError(dVar2,
                            "glPatchParameterfv() call failed for GL_PATCH_DEFAULT_INNER_LEVEL pname"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                            ,0xe0b);
            (**(code **)(lVar4 + 0xfd0))(0x8e74,&local_1f8);
            dVar2 = (**(code **)(lVar4 + 0x800))();
            msg = "glPatchParameterfv() call failed for GL_PATCH_DEFAULT_OUTER_LEVEL pname";
            iVar1 = 0xe10;
            goto LAB_00d3be73;
          }
        }
        else {
          if (p_Var9->type != TESSELLATION_TEST_TYPE_FIRST) {
            pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar7,"Unrecognized test type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                       ,0xe17);
            __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          (**(code **)(lVar4 + 0x1528))(p_Var9->inner_tess_levels_uniform_location,1,&local_1e0);
          dVar2 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar2,"glUniform2fv() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                          ,0xdfb);
          (**(code **)(lVar4 + 0x15a8))(p_Var9->outer_tess_levels_uniform_location,1,&local_1f8);
          dVar2 = (**(code **)(lVar4 + 0x800))();
          msg = "glUniform4fv() call failed";
          iVar1 = 0xdff;
LAB_00d3be73:
          glu::checkError(dVar2,msg,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                          ,iVar1);
        }
        local_1fc = 0.0;
        local_200 = 0.0;
        TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
                  (TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,local_1f8,
                   this->m_gl_max_tess_gen_level_value,(float *)0x0,&local_1fc);
        TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
                  (p_Var9->vertex_spacing,fStack_1f4,this->m_gl_max_tess_gen_level_value,
                   (float *)0x0,&local_200);
        uVar3 = (int)(long)(local_200 + 1.0) * (int)(long)local_1fc * 0x18;
        (**(code **)(lVar4 + 0x150))(0x8c8e,uVar3,0,0x88e4);
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"glBufferData() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xe37);
        (**(code **)(lVar4 + 0x30))(0);
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"glBeginTransformFeedback() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xe3b);
        (**(code **)(lVar4 + 0x538))(0xe,0,1);
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"glDrawArrays() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xe40);
        (**(code **)(lVar4 + 0x638))();
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"glEndTransformFeedback() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xe43);
        lVar5 = (**(code **)(lVar4 + 0xd00))(0x8c8e,0,uVar3,1);
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"glMapBufferRange() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xe49);
        if (0x17 < uVar3) {
          uVar6 = (ulong)uVar3 / 0x18;
          pfVar10 = (float *)(lVar5 + 0xc);
          do {
            fVar11 = pfVar10[-1] - local_1f8;
            fVar12 = -fVar11;
            if (-fVar11 <= fVar11) {
              fVar12 = fVar11;
            }
            if (1e-05 < fVar12) {
LAB_00d3c0a9:
              TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                        (&local_1d0,(TessellationShaderUtils *)(ulong)p_Var9->vertex_spacing,
                         vertex_spacing);
              local_1b0._0_8_ =
                   ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              this_00 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,
                         "Invalid inner/outer tessellation level used in TE stage;",0x38);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00," expected outer:(",0x11);
              std::ostream::_M_insert<double>((double)local_1f8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::_M_insert<double>((double)fStack_1f4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00," rendered outer:(",0x11);
              std::ostream::_M_insert<double>((double)pfVar10[-1]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::_M_insert<double>((double)*pfVar10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00," vertex spacing mode: ",0x16);
              local_1d8 = local_1d0._M_dataplus._M_p;
              this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&local_1d8);
              tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_138);
              pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar7,"Invalid inner/outer tessellation level used in TE stage",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                         ,0xe63);
              __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            fVar11 = *pfVar10 - fStack_1f4;
            fVar12 = -fVar11;
            if (-fVar11 <= fVar11) {
              fVar12 = fVar11;
            }
            if (1e-05 < fVar12) goto LAB_00d3c0a9;
            pfVar10 = pfVar10 + 6;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        (**(code **)(lVar4 + 0x1670))(0x8c8e);
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"glUnmapBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xe69);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      p_Var9 = p_Var9 + 1;
    } while (p_Var9 != (this->m_tests).
                       super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTCTEgl_TessLevel::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize ES test objects */
	initTest();

	/* Our program object takes a single vertex per patch */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() call failed");

	/* Prepare for rendering */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");

	/* We will iterate through all added tests. */
	for (_tests_const_iterator test_iterator = m_tests.begin(); test_iterator != m_tests.end(); ++test_iterator)
	{
		/* Iterate through a few different inner/outer tessellation level combinations */
		glw::GLfloat tessellation_level_combinations[] = {
			/* inner[0] */ /* inner[1] */ /* outer[0] */ /* outer[1] */ /* outer[2] */ /* outer[3] */
			1.1f, 1.4f, 2.7f, 3.1f, 4.4f, 5.7f, 64.2f, 32.5f, 16.8f, 8.2f, 4.5f, 2.8f, 3.3f, 6.6f, 9.9f, 12.3f, 15.6f,
			18.9f
		};
		const unsigned int n_tessellation_level_combinations = sizeof(tessellation_level_combinations) /
															   sizeof(tessellation_level_combinations[0]) /
															   6; /* 2 inner + 4 outer levels */

		for (unsigned int n_combination = 0; n_combination < n_tessellation_level_combinations; ++n_combination)
		{
			glw::GLfloat inner_tess_level[] = { tessellation_level_combinations[n_combination * 6 + 0],
												tessellation_level_combinations[n_combination * 6 + 1] };

			glw::GLfloat outer_tess_level[] = { tessellation_level_combinations[n_combination * 6 + 2],
												tessellation_level_combinations[n_combination * 6 + 3],
												tessellation_level_combinations[n_combination * 6 + 4],
												tessellation_level_combinations[n_combination * 6 + 5] };

			/* Test type determines how the tessellation levels should be set. */
			gl.useProgram(test_iterator->po_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

			switch (test_iterator->type)
			{
			case TESSELLATION_TEST_TYPE_TCS_TES:
			{
				gl.uniform2fv(test_iterator->inner_tess_levels_uniform_location, 1, /* count */
							  inner_tess_level);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform2fv() call failed");

				gl.uniform4fv(test_iterator->outer_tess_levels_uniform_location, 1, /* count */
							  outer_tess_level);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed");

				break;
			}

			case TESSELLATION_TEST_TYPE_TES:
			{
				if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
				{
					gl.patchParameterfv(GL_PATCH_DEFAULT_INNER_LEVEL, inner_tess_level);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameterfv() call failed for"
													   " GL_PATCH_DEFAULT_INNER_LEVEL pname");

					gl.patchParameterfv(GL_PATCH_DEFAULT_OUTER_LEVEL, outer_tess_level);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameterfv() call failed for"
													   " GL_PATCH_DEFAULT_OUTER_LEVEL pname");
				}
				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized test type");
			}
			} /* switch (test_iterator->type) */

			/* Set up storage properties for the buffer object, to which XFBed data will be
			 * written:
			 *
			 * op(Outer[0])   tells how many times amount of points should be multiplied.
			 * op(Outer[1])+1 tells how many points we will receive.
			 *
			 * where op() defines an operator, behavior of which is determined by the vertex
			 * ordering mode specified in tessellation evaluation shader.
			 *
			 * Hence, we should be expecting Outer[0] * (Outer[1] + 1) points.
			 **/
			float outer_level0_clamped = 0.0f;
			float outer_level1_clamped = 0.0f;

			TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
				TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, outer_tess_level[0], m_gl_max_tess_gen_level_value,
				DE_NULL, /* out_clamped */
				&outer_level0_clamped);
			TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
				test_iterator->vertex_spacing, outer_tess_level[1], m_gl_max_tess_gen_level_value,
				DE_NULL, /* out_clamped */
				&outer_level1_clamped);

			const unsigned int n_bytes_needed = static_cast<unsigned int>(
				(unsigned int)(outer_level0_clamped) * (unsigned int)(outer_level1_clamped + 1) *
				(2 /* vec2 */ + 4 /* vec4 */) * sizeof(float));

			gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, n_bytes_needed, NULL /* data */, GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed");

			/* Render the test geometry */
			gl.beginTransformFeedback(GL_POINTS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed");
			{
				/* A single vertex will do, since we configured GL_PATCH_VERTICES_EXT to be 1 */
				gl.drawArrays(GL_PATCHES_EXT, 0 /* first */, 1 /* count */);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed");
			}
			gl.endTransformFeedback();
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

			/* Now that the BO is filled with data, map it so we can check the storage's contents */
			const float* mapped_data_ptr = (const float*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
																		   n_bytes_needed, GL_MAP_READ_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

			/* Verify the contents. For each result vertex, inner/outer tessellation levels should
			 * be unchanged. */
			const float		   epsilon = (float)1e-5;
			const unsigned int n_result_points =
				static_cast<unsigned int>(n_bytes_needed / sizeof(float) / (2 /* vec2 */ + 4 /* vec4 */));

			for (unsigned int n_point = 0; n_point < n_result_points; ++n_point)
			{
				const float* point_data_ptr = mapped_data_ptr + (2 /* vec2 */ + 4 /* vec4 */) * n_point;

				if (de::abs(point_data_ptr[2] - outer_tess_level[0]) > epsilon ||
					de::abs(point_data_ptr[3] - outer_tess_level[1]) > epsilon)
				{
					std::string vertex_spacing_mode_string =
						TessellationShaderUtils::getESTokenForVertexSpacingMode(test_iterator->vertex_spacing);

					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid inner/outer tessellation level used in TE stage;"
									   << " expected outer:(" << outer_tess_level[0] << ", " << outer_tess_level[1]
									   << ") "
									   << " rendered outer:(" << point_data_ptr[2] << ", " << point_data_ptr[3] << ")"
									   << " vertex spacing mode: " << vertex_spacing_mode_string.c_str()
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Invalid inner/outer tessellation level used in TE stage");
				}
			} /* for (all points) */

			/* All done - unmap the storage */
			gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
		} /* for (all tess level combinations) */
	}	 /* for (all tests) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}